

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDFAcroFormDocumentHelper.cc
# Opt level: O2

bool __thiscall QPDFAcroFormDocumentHelper::hasAcroForm(QPDFAcroFormDocumentHelper *this)

{
  bool bVar1;
  allocator<char> local_39;
  QPDFObjectHandle local_38;
  string local_28;
  
  QPDF::getRoot((QPDF *)&local_38);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_28,"/AcroForm",&local_39);
  bVar1 = QPDFObjectHandle::hasKey(&local_38,&local_28);
  std::__cxx11::string::~string((string *)&local_28);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_38.super_BaseHandle.obj.
              super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  return bVar1;
}

Assistant:

bool
QPDFAcroFormDocumentHelper::hasAcroForm()
{
    return qpdf.getRoot().hasKey("/AcroForm");
}